

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O3

size_t __thiscall
sai::VirtualFileEntry::Read
          (VirtualFileEntry *this,span<std::byte,_18446744073709551615UL> Destination)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  size_t sVar3;
  _Atomic_word _Var4;
  void *__s;
  __extent_storage<18446744073709551615UL> _Var5;
  size_t __n;
  __extent_storage<18446744073709551615UL> _Var6;
  ulong uVar7;
  bool bVar8;
  VirtualPage local_1030;
  
  _Var5 = Destination._M_extent._M_extent_value;
  this_00 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  _Var6._M_extent_value = _Var5._M_extent_value;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var4 = this_00->_M_use_count;
    do {
      if (_Var4 == 0) goto LAB_00108084;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar8 = _Var4 == iVar1;
      if (bVar8) {
        this_00->_M_use_count = _Var4 + 1;
        iVar1 = _Var4;
      }
      _Var4 = iVar1;
      UNLOCK();
    } while (!bVar8);
    peVar2 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0 && this_00->_M_use_count != 0) {
      __s = operator_new__(0x1000);
      memset(__s,0,0x1000);
      do {
        while( true ) {
          std::istream::seekg((long)peVar2,(int)(this->PageIndex << 0xc) + (int)this->PageOffset);
          uVar7 = this->PageOffset + _Var6._M_extent_value;
          __n = 0x1000 - this->PageOffset;
          sVar3 = 0;
          if (uVar7 < 0x1000) {
            __n = _Var6._M_extent_value;
            sVar3 = uVar7;
          }
          this->PageOffset = sVar3;
          std::istream::read((char *)peVar2,(long)__s);
          memcpy(Destination._M_ptr + (_Var5._M_extent_value - _Var6._M_extent_value),__s,__n);
          this->Offset = this->Offset + __n;
          _Var6._M_extent_value = _Var6._M_extent_value - __n;
          if (uVar7 < 0x1000) break;
          GetTablePage(&local_1030,this,this->PageIndex);
          this->PageIndex =
               (ulong)*(uint *)((long)&local_1030 + (ulong)((uint)this->PageIndex & 0x1ff) * 8 + 4);
        }
      } while (_Var6._M_extent_value != 0);
      operator_delete__(__s);
      _Var6._M_extent_value = 0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00108084:
  return _Var5._M_extent_value - _Var6._M_extent_value;
}

Assistant:

std::size_t VirtualFileEntry::Read(std::span<std::byte> Destination)
{
	std::size_t LeftToRead    = Destination.size();
	bool        NeedsNextPage = false;

	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		std::unique_ptr<std::byte[]> ReadBuffer
			= std::make_unique<std::byte[]>(VirtualPage::PageSize);

		while( Stream )
		{
			Stream->seekg(PageIndex * VirtualPage::PageSize + PageOffset, std::ios::beg);

			std::size_t Read;
			if( LeftToRead + PageOffset >= VirtualPage::PageSize )
			{
				Read          = VirtualPage::PageSize - PageOffset;
				PageOffset    = 0;
				NeedsNextPage = true;
			}
			else
			{
				Read = LeftToRead;
				PageOffset += Read;
			}

			Stream->read(reinterpret_cast<char*>(ReadBuffer.get()), Read);
			const std::size_t BytesWritten = Destination.size() - LeftToRead;
			std::memcpy(Destination.data() + BytesWritten, ReadBuffer.get(), Read);

			Offset += Read;
			LeftToRead -= Read;

			if( NeedsNextPage )
			{
				// NOTE: The reason this is here, instead of moving it into the
				// `if (LeftToRead...)` is because `GetTablePage` seeks the
				// stream which mess-ups its position.
				PageIndex = GetTablePage(PageIndex)
								.PageEntries[PageIndex % VirtualPage::TableSpan]
								.NextPageIndex;
				NeedsNextPage = false;
			}
			else if( LeftToRead == 0 )
				break;
		}
	}

	return Destination.size() - LeftToRead;
}